

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_shift.hpp
# Opt level: O1

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator<<(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *out,status_type *S)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  wostream *pwVar5;
  wchar_t local_20;
  wchar_t local_1c;
  
  lVar2 = *(long *)out;
  lVar3 = *(long *)(lVar2 + -0x18);
  uVar1 = *(undefined4 *)(out + lVar3 + 0x18);
  *(undefined4 *)(out + lVar3 + 0x18) = 0x26;
  plVar4 = *(long **)(out + *(long *)(lVar2 + -0x18) + 0xf0);
  if (plVar4 != (long *)0x0) {
    local_20 = (**(code **)(*plVar4 + 0x50))(plVar4,0x28);
    pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)out,&local_20,1);
    pwVar5 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar5);
    plVar4 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
    if (plVar4 != (long *)0x0) {
      local_1c = (**(code **)(*plVar4 + 0x50))(plVar4,0x29);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar5,&local_1c,1);
      *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
      return out;
    }
  }
  std::__throw_bad_cast();
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const status_type &S) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << S.r << ')';
        out.flags(flags);
        return out;
      }